

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_cpuid_x86_64(CPUX86State *env)

{
  bool bVar1;
  uintptr_t unaff_retaddr;
  list_item *local_38;
  list_item *cur;
  void *pvStack_28;
  int skip_cpuid;
  hook *hook;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  CPUX86State *env_local;
  
  cur._4_4_ = 0;
  _ebx = env;
  cpu_svm_check_intercept_param_x86_64(env,0x72,0,unaff_retaddr);
  local_38 = _ebx->uc->hook[1].head;
  while( true ) {
    bVar1 = false;
    if (local_38 != (list_item *)0x0) {
      pvStack_28 = local_38->data;
      bVar1 = pvStack_28 != (void *)0x0;
    }
    if (!bVar1) break;
    if ((((*(byte *)((long)pvStack_28 + 0x14) & 1) == 0) &&
        (((*(ulong *)((long)pvStack_28 + 0x18) <= _ebx->eip &&
          (_ebx->eip <= *(ulong *)((long)pvStack_28 + 0x20))) ||
         (*(ulong *)((long)pvStack_28 + 0x20) < *(ulong *)((long)pvStack_28 + 0x18))))) &&
       ((*(byte *)((long)pvStack_28 + 0x14) & 1) == 0)) {
      if (*(int *)((long)pvStack_28 + 4) == 0x71) {
        cur._4_4_ = (**(code **)((long)pvStack_28 + 0x28))
                              (_ebx->uc,*(undefined8 *)((long)pvStack_28 + 0x30));
      }
      if ((_ebx->uc->stop_request & 1U) != 0) break;
    }
    local_38 = local_38->next;
  }
  if (cur._4_4_ == 0) {
    cpu_x86_cpuid_x86_64
              (_ebx,(uint32_t)_ebx->regs[0],(uint32_t)_ebx->regs[1],&ecx,&edx,
               (uint32_t *)((long)&hook + 4),(uint32_t *)&hook);
    _ebx->regs[0] = (ulong)ecx;
    _ebx->regs[3] = (ulong)edx;
    _ebx->regs[1] = (ulong)hook._4_4_;
    _ebx->regs[2] = (ulong)(uint)hook;
  }
  return;
}

Assistant:

void helper_cpuid(CPUX86State *env)
{
    uint32_t eax, ebx, ecx, edx;
    struct hook *hook;
    int skip_cpuid = 0;

    cpu_svm_check_intercept_param(env, SVM_EXIT_CPUID, 0, GETPC());

    // Unicorn: call registered CPUID hooks
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(env->uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (!HOOK_BOUND_CHECK(hook, env->eip))
            continue;
        
        // Multiple cpuid callbacks returning different values is undefined.
        // true -> skip the cpuid instruction
        if (hook->insn == UC_X86_INS_CPUID)
            skip_cpuid = ((uc_cb_insn_cpuid_t)hook->callback)(env->uc, hook->user_data);

        // the last callback may already asked to stop emulation
        if (env->uc->stop_request)
            break;
    }

    if (!skip_cpuid) {
        cpu_x86_cpuid(env, (uint32_t)env->regs[R_EAX], (uint32_t)env->regs[R_ECX],
                    &eax, &ebx, &ecx, &edx);
        env->regs[R_EAX] = eax;
        env->regs[R_EBX] = ebx;
        env->regs[R_ECX] = ecx;
        env->regs[R_EDX] = edx;
    }
    
}